

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O0

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>
duckdb::AttachInfo::Deserialize(Deserializer *deserializer)

{
  Deserializer *this;
  pointer pAVar1;
  Deserializer *this_00;
  pointer this_01;
  unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_> *in_RSI;
  ParseInfo *in_RDI;
  Deserializer *unaff_retaddr;
  unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true> result;
  pointer in_stack_ffffffffffffff78;
  unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_> *tag;
  AttachInfo *in_stack_ffffffffffffff80;
  unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_> *ret;
  field_id_t field_id;
  _Head_base<0UL,_duckdb::ParseInfo_*,_false> _Var2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  *in_stack_ffffffffffffffe8;
  ParseInfo *pPVar3;
  field_id_t field_id_00;
  
  _Var2._M_head_impl = in_RDI;
  pPVar3 = in_RDI;
  this = (Deserializer *)operator_new(0x90);
  field_id_00 = (field_id_t)((ulong)pPVar3 >> 0x30);
  AttachInfo(in_stack_ffffffffffffff80);
  unique_ptr<duckdb::AttachInfo,std::default_delete<duckdb::AttachInfo>,true>::
  unique_ptr<std::default_delete<duckdb::AttachInfo>,void>
            ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pAVar1 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)in_stack_ffffffffffffff80);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (this,(field_id_t)((ulong)_Var2._M_head_impl >> 0x30),(char *)in_RDI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar1);
  ret = in_RSI;
  this_00 = (Deserializer *)
            unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::
            operator->((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                        *)in_stack_ffffffffffffff80);
  field_id = (field_id_t)((ulong)in_RSI >> 0x30);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (this,(field_id_t)((ulong)_Var2._M_head_impl >> 0x30),(char *)in_RDI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar1);
  tag = ret;
  pAVar1 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                       *)in_stack_ffffffffffffff80);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
            (unaff_retaddr,field_id_00,(char *)tag,in_stack_ffffffffffffffe8);
  this_01 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::
            operator->((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>
                        *)in_stack_ffffffffffffff80);
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::OnCreateConflict>
            (this_00,field_id,(char *)pAVar1,(OnCreateConflict *)ret,
             (OnCreateConflict)((ulong)this_01 >> 0x38));
  unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>::
  unique_ptr<duckdb::AttachInfo,std::default_delete<std::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>>>,void>
            ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)this_01,
             tag);
  unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true> *)
             0xae153e);
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (_Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>)
         _Var2._M_head_impl;
}

Assistant:

unique_ptr<ParseInfo> AttachInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<AttachInfo>(new AttachInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "name", result->name);
	deserializer.ReadPropertyWithDefault<string>(201, "path", result->path);
	deserializer.ReadPropertyWithDefault<unordered_map<string, Value>>(202, "options", result->options);
	deserializer.ReadPropertyWithExplicitDefault<OnCreateConflict>(203, "on_conflict", result->on_conflict, OnCreateConflict::ERROR_ON_CONFLICT);
	return std::move(result);
}